

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilSort.c
# Opt level: O2

void Abc_QuickSort2(word *pData,int nSize,int fDecrease)

{
  word wVar1;
  word wVar2;
  long lVar3;
  int iVar4;
  uint r;
  ulong uVar5;
  ulong uVar6;
  int l;
  ulong uVar7;
  ulong uVar8;
  
  r = nSize - 1;
  l = 0;
  if (fDecrease != 0) {
    Abc_QuickSort2Dec_rec(pData,0,r);
    return;
  }
LAB_0039c8fe:
  iVar4 = r - l;
  if (iVar4 == 0 || (int)r < l) {
    return;
  }
  if (iVar4 < 10) {
    Abc_SelectSortInc(pData + l,iVar4 + 1);
    return;
  }
  wVar1 = pData[(int)r];
  uVar8 = (ulong)(l - 1);
  uVar6 = (ulong)r;
  do {
    uVar8 = (long)(int)uVar8;
    do {
      uVar7 = uVar8;
      wVar2 = pData[uVar7 + 1];
      uVar8 = uVar7 + 1;
    } while ((uint)wVar2 < (uint)wVar1);
    uVar5 = (long)(int)uVar6;
    do {
      lVar3 = uVar5 - 1;
      uVar6 = uVar5 - 1;
      if (l + 1 == (int)uVar5) break;
      uVar5 = uVar6;
    } while ((uint)wVar1 < (uint)pData[lVar3]);
    if ((long)uVar6 <= (long)uVar8) break;
    pData[uVar8] = pData[lVar3];
    pData[uVar6] = wVar2;
  } while( true );
  pData[uVar8] = pData[(int)r];
  pData[(int)r] = wVar2;
  Abc_QuickSort2Inc_rec(pData,l,(int)uVar7);
  l = (int)uVar7 + 2;
  goto LAB_0039c8fe;
}

Assistant:

void Abc_QuickSort2( word * pData, int nSize, int fDecrease )
{
    int i, fVerify = 0;
    if ( fDecrease )
    {
        Abc_QuickSort2Dec_rec( pData, 0, nSize - 1 );
        if ( fVerify )
            for ( i = 1; i < nSize; i++ )
                assert( (unsigned)pData[i-1] >= (unsigned)pData[i] );
    }
    else
    {
        Abc_QuickSort2Inc_rec( pData, 0, nSize - 1 );
        if ( fVerify )
            for ( i = 1; i < nSize; i++ )
                assert( (unsigned)pData[i-1] <= (unsigned)pData[i] );
    }
}